

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

ModelPtr prepareImportUnitsWithReferenceToNonStandardUnits(string *importUnitsName)

{
  string *psVar1;
  byte bVar2;
  char cVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ModelPtr MVar5;
  ImporterPtr i;
  UnitsPtr u4;
  ModelPtr unitsModel;
  UnitsPtr u5;
  ModelPtr model;
  UnitsPtr u2;
  AssertionResult gtest_ar_;
  VariablePtr v;
  ComponentPtr c;
  ImportSourcePtr import;
  UnitsPtr u3;
  UnitsPtr u1;
  AssertionResult local_130;
  long local_120 [2];
  string *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  long local_100 [2];
  long *local_f0;
  AssertHelper local_e8 [8];
  shared_ptr *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  shared_ptr *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  long local_a0 [2];
  byte local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  shared_ptr *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Units_Database","");
  libcellml::Model::create((string *)&local_e0);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"main_model","");
  libcellml::Model::create((string *)&local_c0);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"fmol","");
  libcellml::Units::create((string *)&local_40);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"mole","");
  local_110 = (string *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"femto","");
  local_b0 = (string *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  libcellml::Units::addUnit(local_40,(string *)&local_130,1.0,1.0,(string *)&local_110);
  if (local_b0 != (string *)local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_110 != (string *)local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"per_fmol","");
  libcellml::Units::create((string *)&local_b0);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  psVar1 = local_b0;
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"fmol","");
  local_110 = (string *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  libcellml::Units::addUnit(psVar1,-1.0,(string *)&local_130);
  if (local_110 != (string *)local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"per_sec","");
  libcellml::Units::create((string *)&local_50);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"second","");
  local_110 = (string *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  libcellml::Units::addUnit(local_50,-1.0,(string *)&local_130);
  if (local_110 != (string *)local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"per_sec_fmol","");
  libcellml::Units::create((string *)&local_110);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  psVar1 = local_110;
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"per_sec","");
  libcellml::Units::addUnit(psVar1);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  psVar1 = local_110;
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"per_fmol","");
  libcellml::Units::addUnit(psVar1);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  libcellml::Units::create((string *)&local_d0);
  libcellml::Model::addUnits(local_e0);
  libcellml::Model::addUnits(local_e0);
  libcellml::Model::addUnits(local_e0);
  libcellml::Model::addUnits(local_e0);
  libcellml::ImportSource::create();
  psVar1 = local_60;
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"I_am_a_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  libcellml::ImportSource::setModel((shared_ptr *)local_60);
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"env","");
  libcellml::Component::create((string *)&local_70);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"v","");
  libcellml::Variable::create((string *)&local_80);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_d0 + 0x10));
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"per_sec_fmol","");
  libcellml::ImportedEntity::setImportReference((string *)(local_d0 + 0x10));
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0] + 1);
  }
  libcellml::Variable::setUnits(local_80);
  libcellml::Component::addVariable(local_70);
  libcellml::Model::addUnits(local_c0);
  libcellml::ComponentEntity::addComponent(local_c0);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_90[0] = bVar2 ^ 1;
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,(char *)local_90,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xb5b,(char *)local_130._0_8_);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if ((long *)local_130._0_8_ != local_120) {
      operator_delete((void *)local_130._0_8_,local_120[0] + 1);
    }
    if (local_f0 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f0 != (long *)0x0)) {
        (**(code **)(*local_f0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::create(SUB81(&local_130,0));
  libcellml::Importer::flattenModel((shared_ptr *)importUnitsName);
  _Var4._M_pi = extraout_RDX;
  if (local_130.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.message_.ptr_);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    _Var4._M_pi = extraout_RDX_01;
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    _Var4._M_pi = extraout_RDX_02;
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    _Var4._M_pi = extraout_RDX_03;
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
    _Var4._M_pi = extraout_RDX_04;
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
    _Var4._M_pi = extraout_RDX_05;
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    _Var4._M_pi = extraout_RDX_06;
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    _Var4._M_pi = extraout_RDX_07;
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var4._M_pi = extraout_RDX_08;
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
    _Var4._M_pi = extraout_RDX_09;
  }
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
    _Var4._M_pi = extraout_RDX_10;
  }
  MVar5.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  MVar5.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)importUnitsName;
  return (ModelPtr)MVar5.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr prepareImportUnitsWithReferenceToNonStandardUnits(const std::string &importUnitsName)
{
    libcellml::ModelPtr unitsModel = libcellml::Model::create("Units_Database");
    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr u1 = libcellml::Units::create("fmol");
    u1->addUnit("mole", "femto");
    libcellml::UnitsPtr u2 = libcellml::Units::create("per_fmol");
    u2->addUnit("fmol", -1.0);
    libcellml::UnitsPtr u3 = libcellml::Units::create("per_sec");
    u3->addUnit("second", -1.0);
    libcellml::UnitsPtr u4 = libcellml::Units::create("per_sec_fmol");
    u4->addUnit("per_sec");
    u4->addUnit("per_fmol");
    libcellml::UnitsPtr u5 = libcellml::Units::create(importUnitsName);

    unitsModel->addUnits(u1);
    unitsModel->addUnits(u2);
    unitsModel->addUnits(u3);
    unitsModel->addUnits(u4);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(unitsModel);

    libcellml::ComponentPtr c = libcellml::Component::create("env");
    libcellml::VariablePtr v = libcellml::Variable::create("v");

    u5->setImportSource(import);
    u5->setImportReference("per_sec_fmol");

    v->setUnits(u5);
    c->addVariable(v);
    model->addUnits(u5);
    model->addComponent(c);

    EXPECT_FALSE(model->hasUnresolvedImports());

    libcellml::ImporterPtr i = libcellml::Importer::create();

    return i->flattenModel(model);
}